

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rest.cpp
# Opt level: O1

bool rest_deploymentinfo(any *context,HTTPRequest *req,string *str_uri_part)

{
  UniValue val;
  span<const_std::byte,_18446744073709551615UL> reply;
  bool bVar1;
  RESTResponseFormat RVar2;
  ChainstateManager *pCVar3;
  CBlockIndex *pCVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  pointer pUVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  long in_FS_OFFSET;
  string_view str;
  optional<uint256> hash;
  string hash_str;
  undefined8 in_stack_fffffffffffffc18;
  _Alloc_hider in_stack_fffffffffffffc20;
  _Alloc_hider _Var8;
  size_type in_stack_fffffffffffffc28;
  undefined8 in_stack_fffffffffffffc30;
  undefined8 in_stack_fffffffffffffc38;
  undefined4 uVar9;
  undefined4 in_stack_fffffffffffffc44;
  undefined8 uVar10;
  undefined1 uVar11;
  undefined7 uVar12;
  undefined1 uVar13;
  undefined4 uVar14;
  undefined2 uVar15;
  undefined1 uVar16;
  undefined1 uVar17;
  undefined4 uVar18;
  undefined2 uVar19;
  undefined1 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined1 auStack_380 [16];
  undefined1 auStack_370 [40];
  vector<RPCResult,_std::allocator<RPCResult>_> local_348;
  _Alloc_hider local_330;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320;
  undefined1 local_308 [16];
  undefined1 local_2f8 [8];
  undefined1 local_2f0 [40];
  vector<UniValue,_std::allocator<UniValue>_> local_2c8;
  undefined1 local_2a8 [16];
  undefined1 local_298 [56];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_240;
  vector<UniValue,_std::allocator<UniValue>_> local_228;
  string local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  undefined1 *local_1d0;
  undefined8 local_1c8;
  undefined1 local_1c0;
  undefined7 uStack_1bf;
  char cStack_1b8;
  undefined4 local_1b7;
  undefined2 local_1b3;
  char local_1b1;
  undefined1 local_1b0 [88];
  undefined1 local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_150;
  undefined8 local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  UniValue local_130;
  undefined4 local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  undefined8 local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  undefined8 local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  undefined8 local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  any local_70;
  undefined4 local_60;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = CheckWarmup(req);
  if (!bVar1) {
    bVar1 = false;
    goto LAB_00290a3a;
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  RVar2 = ParseDataFormat(&local_58,str_uri_part);
  if (RVar2 == JSON) {
    local_1b0._8_8_ = (long)&(((_Storage<UniValue,_false> *)local_1b0)->_M_value).val + 0x10;
    local_1b0._0_4_ = VNULL;
    local_1b0[0x18] = 0;
    local_1b0._16_8_ = 0;
    local_1b0._40_8_ = (pointer)0x0;
    local_1b0._48_8_ = (pointer)0x0;
    local_1b0._56_8_ = (pointer)0x0;
    local_1b0._64_8_ = (pointer)0x0;
    local_1b0._72_8_ = (pointer)0x0;
    local_1b0._80_8_ = (pointer)0x0;
    local_158 = 1;
    local_150 = &local_140;
    local_148 = 0;
    local_140._M_local_buf[0] = '\0';
    local_130.val._M_dataplus._M_p = (pointer)&local_130.val.field_2;
    local_130.val._M_string_length = 0;
    local_130.val.field_2._M_local_buf[0] = '\0';
    local_130.typ = VNULL;
    local_d0 = &local_c0;
    local_d8 = 0;
    local_130.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_130.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_130.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_130.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_130.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_130.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c8 = 0;
    local_c0._M_local_buf[0] = '\0';
    local_b0 = &local_a0;
    local_a8 = 0;
    local_a0._M_local_buf[0] = '\0';
    local_90 = &local_80;
    local_88 = 0;
    local_80._M_local_buf[0] = '\0';
    local_60 = 0;
    local_70._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
    local_70._M_storage._M_ptr = (void *)0x0;
    std::any::operator=(&local_70,context);
    local_1d0 = &local_1c0;
    local_1c8 = 0;
    uVar9 = 2;
    uVar10 = &stack0xfffffffffffffc58;
    uVar13 = '\0';
    uVar14 = (undefined4)uStack_1bf;
    uVar15 = (undefined2)((uint7)uStack_1bf >> 0x20);
    uVar16 = (undefined1)((uint7)uStack_1bf >> 0x30);
    uVar11 = '\0';
    uVar12 = 0;
    local_1c0 = 0;
    uVar21 = (pointer)0x0;
    auStack_380._0_8_ = (pointer)0x0;
    auStack_380._8_8_ = (pointer)0x0;
    auStack_370._0_8_ = (pointer)0x0;
    local_130.typ = VARR;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_130.val,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &stack0xfffffffffffffc48);
    local_2f8 = (undefined1  [8])
                local_130.keys.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_308._8_8_ =
         local_130.keys.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_130.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_130.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_308._0_8_ =
         local_130.keys.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    uVar22 = (pointer)0x0;
    local_130.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)uVar21;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_308);
    local_2f8 = (undefined1  [8])
                local_130.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    local_308._8_8_ =
         local_130.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_308._0_8_ =
         local_130.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
         super__Vector_impl_data._M_start;
    pUVar6 = (pointer)auStack_370._0_8_;
    local_130.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)auStack_380._0_8_;
    local_130.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)auStack_380._8_8_;
    local_130.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)auStack_370._0_8_;
    auStack_380._0_8_ = (pointer)0x0;
    auStack_380._8_8_ = (pointer)0x0;
    auStack_370._0_8_ = (pointer)0x0;
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector
              ((vector<UniValue,_std::allocator<UniValue>_> *)local_308);
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector
              ((vector<UniValue,_std::allocator<UniValue>_> *)auStack_380);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&stack0xfffffffffffffc68);
    uVar17 = cStack_1b8;
    uVar18 = local_1b7;
    uVar19 = local_1b3;
    uVar20 = local_1b1;
    if ((undefined1 *)uVar10 != &stack0xfffffffffffffc58) {
      operator_delete((void *)uVar10,CONCAT17(uVar16,CONCAT25(uVar15,CONCAT41(uVar14,uVar13))) + 1);
      uVar17 = cStack_1b8;
      uVar18 = local_1b7;
      uVar19 = local_1b3;
      uVar20 = local_1b1;
    }
    if (local_1d0 != &local_1c0) {
      operator_delete(local_1d0,CONCAT71(uStack_1bf,local_1c0) + 1);
    }
    if ((detail *)local_58._M_string_length == (detail *)0x0) {
LAB_00290da4:
      uVar10 = &stack0xfffffffffffffc50;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stack0xfffffffffffffc40,"Content-Type","");
      local_308._0_8_ = (pointer)local_2f8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"application/json","");
      HTTPRequest::WriteHeader(req,(string *)&stack0xfffffffffffffc40,(string *)local_308);
      if ((pointer)local_308._0_8_ != (pointer)local_2f8) {
        operator_delete((void *)local_308._0_8_,(ulong)((long)local_2f8 + 1));
      }
      if ((undefined1 *)uVar10 != &stack0xfffffffffffffc50) {
        operator_delete((void *)uVar10,CONCAT71(uVar12,uVar11) + 1);
      }
      getdeploymentinfo();
      RPCHelpMan::HandleRequest
                ((UniValue *)local_308,(RPCHelpMan *)&stack0xfffffffffffffc40,
                 (JSONRPCRequest *)&((_Storage<UniValue,_false> *)local_1b0)->_M_value);
      UniValue::write_abi_cxx11_((UniValue *)local_2a8,(int)local_308,(void *)0x0,0);
      pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a8
                      ,"\n");
      local_298._16_8_ = (pbVar5->_M_dataplus)._M_p;
      paVar7 = &pbVar5->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._16_8_ == paVar7) {
        local_298._32_8_ = paVar7->_M_allocated_capacity;
        local_298._40_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
        local_298._16_8_ = local_298 + 0x20;
      }
      else {
        local_298._32_8_ = paVar7->_M_allocated_capacity;
      }
      local_298._24_8_ = pbVar5->_M_string_length;
      (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
      pbVar5->_M_string_length = 0;
      (pbVar5->field_2)._M_local_buf[0] = '\0';
      reply._M_extent._M_extent_value = local_298._24_8_;
      reply._M_ptr = (pointer)local_298._16_8_;
      HTTPRequest::WriteReply(req,200,reply);
      if ((undefined1 *)local_298._16_8_ != local_298 + 0x20) {
        operator_delete((void *)local_298._16_8_,(ulong)(local_298._32_8_ + 1));
      }
      if ((pointer)local_2a8._0_8_ != (pointer)local_298) {
        operator_delete((void *)local_2a8._0_8_,local_298._0_8_ + 1);
      }
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_2c8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_2f0 + 0x10));
      if ((pointer)local_308._8_8_ != (pointer)local_2f0) {
        operator_delete((void *)local_308._8_8_,(ulong)(local_2f0._0_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_330._M_p != &local_320) {
        operator_delete(local_330._M_p,local_320._M_allocated_capacity + 1);
      }
      std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_348);
      std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
                ((vector<RPCArg,_std::allocator<RPCArg>_> *)(auStack_370 + 0x10));
      if ((pointer)auStack_380._0_8_ != (pointer)auStack_370) {
        operator_delete((void *)auStack_380._0_8_,(ulong)(auStack_370._0_8_ + 1));
      }
      if ((undefined1 *)uVar10 != &stack0xfffffffffffffc50) {
        operator_delete((void *)uVar10,CONCAT71(uVar12,uVar11) + 1);
      }
      bVar1 = true;
    }
    else {
      str._M_str = (char *)pUVar6;
      str._M_len = (size_t)local_58._M_dataplus._M_p;
      detail::FromHex<uint256>
                ((optional<uint256> *)&stack0xfffffffffffffc40,(detail *)local_58._M_string_length,
                 str);
      if (uVar17 == '\0') {
        std::operator+(&local_1f0,"Invalid hash: ",&local_58);
        RESTERR(req,HTTP_BAD_REQUEST,&local_1f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
LAB_00290f00:
          operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        pCVar3 = GetChainman(context,req);
        if (pCVar3 != (ChainstateManager *)0x0) {
          local_308._0_8_ = &cs_main;
          local_308._8_8_ = local_308._8_8_ & 0xffffffffffffff00;
          std::unique_lock<std::recursive_mutex>::lock
                    ((unique_lock<std::recursive_mutex> *)local_308);
          pCVar4 = node::BlockManager::LookupBlockIndex
                             (&pCVar3->m_blockman,(uint256 *)&stack0xfffffffffffffc40);
          std::unique_lock<std::recursive_mutex>::~unique_lock
                    ((unique_lock<std::recursive_mutex> *)local_308);
          if (pCVar4 != (CBlockIndex *)0x0) {
            UniValue::
            UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      ((UniValue *)(local_298 + 0x30),&local_58);
            val.val._M_dataplus._M_p = in_stack_fffffffffffffc20._M_p;
            val._0_8_ = in_stack_fffffffffffffc18;
            val.val._M_string_length = in_stack_fffffffffffffc28;
            val.val.field_2._M_allocated_capacity = in_stack_fffffffffffffc30;
            val.val.field_2._8_8_ = in_stack_fffffffffffffc38;
            val.keys.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start._0_4_ = uVar9;
            val.keys.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start._4_4_ = in_stack_fffffffffffffc44;
            val.keys.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)uVar10;
            val.keys.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = uVar11;
            val.keys.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = uVar12;
            val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_start._0_1_ = uVar13;
            val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_start._1_4_ = uVar14;
            val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_start._5_2_ = uVar15;
            val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_start._7_1_ = uVar16;
            val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_finish._0_1_ = uVar17;
            val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_finish._1_4_ = uVar18;
            val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_finish._5_2_ = uVar19;
            val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_finish._7_1_ = uVar20;
            val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)uVar22;
            UniValue::push_back(&local_130,val);
            std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_228);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_240);
            if (local_260 != &local_250) {
              operator_delete(local_260,local_250._M_allocated_capacity + 1);
            }
            goto LAB_00290da4;
          }
          local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"Block not found","")
          ;
          RESTERR(req,HTTP_BAD_REQUEST,&local_210);
          local_1f0.field_2._M_allocated_capacity = local_210.field_2._M_allocated_capacity;
          local_1f0._M_dataplus._M_p = local_210._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_210._M_dataplus._M_p != &local_210.field_2) goto LAB_00290f00;
        }
      }
      bVar1 = false;
    }
    JSONRPCRequest::~JSONRPCRequest
              ((JSONRPCRequest *)&((_Storage<UniValue,_false> *)local_1b0)->_M_value);
  }
  else {
    _Var8._M_p = &stack0xfffffffffffffc30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xfffffffffffffc20,"output format not found (available: json)","");
    RESTERR(req,HTTP_NOT_FOUND,(string *)&stack0xfffffffffffffc20);
    if (_Var8._M_p != &stack0xfffffffffffffc30) {
      operator_delete(_Var8._M_p,in_stack_fffffffffffffc30 + 1);
    }
    bVar1 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
LAB_00290a3a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

static bool rest_deploymentinfo(const std::any& context, HTTPRequest* req, const std::string& str_uri_part)
{
    if (!CheckWarmup(req)) return false;

    std::string hash_str;
    const RESTResponseFormat rf = ParseDataFormat(hash_str, str_uri_part);

    switch (rf) {
    case RESTResponseFormat::JSON: {
        JSONRPCRequest jsonRequest;
        jsonRequest.context = context;
        jsonRequest.params = UniValue(UniValue::VARR);

        if (!hash_str.empty()) {
            auto hash{uint256::FromHex(hash_str)};
            if (!hash) {
                return RESTERR(req, HTTP_BAD_REQUEST, "Invalid hash: " + hash_str);
            }

            const ChainstateManager* chainman = GetChainman(context, req);
            if (!chainman) return false;
            if (!WITH_LOCK(::cs_main, return chainman->m_blockman.LookupBlockIndex(*hash))) {
                return RESTERR(req, HTTP_BAD_REQUEST, "Block not found");
            }

            jsonRequest.params.push_back(hash_str);
        }

        req->WriteHeader("Content-Type", "application/json");
        req->WriteReply(HTTP_OK, getdeploymentinfo().HandleRequest(jsonRequest).write() + "\n");
        return true;
    }
    default: {
        return RESTERR(req, HTTP_NOT_FOUND, "output format not found (available: json)");
    }
    }

}